

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double>::load_impl<0ul,1ul>
          (tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double> *this,sequence *seq,
          byte convert)

{
  type *this_00;
  type *this_01;
  const_iterator pbVar1;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle local_98;
  PyObject *local_90;
  sequence_accessor local_78;
  handle local_58;
  PyObject *local_50;
  bool local_42;
  undefined1 local_41;
  initializer_list<bool> local_40;
  initializer_list<bool> *local_30;
  initializer_list<bool> *__range3;
  sequence *psStack_20;
  bool convert_local;
  sequence *seq_local;
  tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double> *this_local;
  
  __range3._7_1_ = convert & 1;
  psStack_20 = seq;
  seq_local = (sequence *)this;
  this_00 = std::
            get<0ul,pybind11::detail::type_caster<Eigen::Matrix<double,1,3,1,1,3>,void>,pybind11::detail::type_caster<double,void>>
                      ((pair<pybind11::detail::type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  sequence::operator[](&local_78,psStack_20,0);
  accessor::operator_cast_to_object((accessor *)&local_58);
  local_50 = local_58.m_ptr;
  local_42 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                       (this_00,local_58,(bool)(__range3._7_1_ & 1));
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<Eigen::Matrix<double,1,3,1,1,3>,void>,pybind11::detail::type_caster<double,void>>
                      ((pair<pybind11::detail::type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  sequence::operator[]((sequence_accessor *)&__begin0,psStack_20,1);
  accessor::operator_cast_to_object((accessor *)&local_98);
  local_90 = local_98.m_ptr;
  local_41 = type_caster<double,_void>::load(this_01,local_98,(bool)(__range3._7_1_ & 1));
  local_40._M_array = &local_42;
  local_40._M_len = 2;
  pybind11::object::~object((object *)&local_98);
  accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::sequence_item> *)&__begin0);
  pybind11::object::~object((object *)&local_58);
  accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor(&local_78);
  local_30 = &local_40;
  __end0 = std::initializer_list<bool>::begin(local_30);
  pbVar1 = std::initializer_list<bool>::end(local_30);
  while( true ) {
    if (__end0 == pbVar1) {
      return true;
    }
    if ((*__end0 & 1U) == 0) break;
    __end0 = __end0 + 1;
  }
  return false;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
        return true;
    }